

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
HdlcSimulationDataGenerator::GenAddressField
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          HdlcSimulationDataGenerator *this,HdlcAddressType addressType,U64 addressBytes,U8 value)

{
  pointer *ppuVar1;
  iterator __position;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  U8 extValue;
  uchar local_32;
  uchar local_31;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (addressType == HDLC_BASIC_ADDRESS_FIELD) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
               (iterator)0x0,&local_31);
  }
  else if (addressBytes != 0) {
    uVar2 = 0;
    uVar3 = 1;
    do {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   __position,&local_32);
      }
      else {
        *__position._M_current = addressBytes - 1 != uVar2 | value & 0xfe;
        ppuVar1 = &(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      bVar4 = uVar3 < addressBytes;
      uVar2 = uVar3;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::GenAddressField( HdlcAddressType addressType, U64 addressBytes, U8 value ) const
{
    vector<U8> addrRet;
    if( addressType == HDLC_BASIC_ADDRESS_FIELD )
    {
        addrRet.push_back( value );
    }
    else // addressType == HDLC_EXTENDED_ADDRESS_FIELD
    {
        for( U32 i = 0; i < addressBytes; ++i )
        {
            U8 mask = ( i == addressBytes - 1 ) ? 0x00 : 0x01; // EA bit (Lsb is set to 1 to extend the address recursively)
            U8 extValue = ( value & 0xFE ) | mask;
            addrRet.push_back( extValue );
        }
    }
    return addrRet;
}